

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O0

void anon_unknown.dwarf_15b07f::printSpeed
               (int ref_elapsed_time,int elapsed_time,int width,int height)

{
  ostream *poVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),2);
  poVar1 = std::operator<<((ostream *)&std::cout,"[          ] ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
  poVar1 = std::operator<<(poVar1,"x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ECX);
  poVar1 = std::operator<<(poVar1,": C time = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDI);
  poVar1 = std::operator<<(poVar1," us, SIMD time = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1," us");
  poVar1 = std::operator<<(poVar1," (~");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)in_EDI / (double)in_ESI);
  poVar1 = std::operator<<(poVar1,"x) ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void printSpeed(int ref_elapsed_time, int elapsed_time, int width,
                       int height) {
  std::cout.precision(2);
  std::cout << "[          ] " << width << "x" << height
            << ": C time = " << ref_elapsed_time
            << " us, SIMD time = " << elapsed_time << " us"
            << " (~" << ref_elapsed_time / (double)elapsed_time << "x) "
            << std::endl;
}